

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

iterator * __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InnerMap::InsertUnique(iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  bool bVar1;
  long *k;
  LogMessage *pLVar2;
  unsigned_long *puVar3;
  LogFinisher local_162;
  byte local_161;
  LogMessage local_160;
  iterator local_128;
  iterator local_110;
  LogFinisher local_f2;
  byte local_f1;
  LogMessage local_f0;
  iterator local_b8;
  iterator local_a0;
  undefined1 local_88 [8];
  iterator result;
  LogMessage local_58;
  Node *local_20;
  Node *node_local;
  size_type b_local;
  InnerMap *this_local;
  
  bVar1 = false;
  local_20 = node;
  node_local = (Node *)b;
  b_local = (size_type)this;
  if ((this->index_of_first_non_null_ != this->num_buckets_) &&
     (this->table_[this->index_of_first_non_null_] == (void *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x28f);
    bVar1 = true;
    pLVar2 = internal::LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: index_of_first_non_null_ == num_buckets_ || table_[index_of_first_non_null_] != NULL: "
                       );
    internal::LogFinisher::operator=((LogFinisher *)((long)&result.bucket_index_ + 3),pLVar2);
  }
  if (bVar1) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  iterator_base<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  ::iterator_base((iterator_base<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
                   *)local_88);
  k = KeyPtrFromNodePtr(local_20);
  find(&local_a0,this,k);
  end(&local_b8,this);
  bVar1 = protobuf::operator==(&local_a0,&local_b8);
  local_f1 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x295);
    local_f1 = 1;
    pLVar2 = internal::LogMessage::operator<<
                       (&local_f0,"CHECK failed: find(*KeyPtrFromNodePtr(node)) == end(): ");
    internal::LogFinisher::operator=(&local_f2,pLVar2);
  }
  if ((local_f1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_f0);
  }
  bVar1 = TableEntryIsEmpty(this,(size_type)node_local);
  if (bVar1) {
    InsertUniqueInList(&local_110,this,(size_type)node_local,local_20);
    local_88 = (undefined1  [8])local_110.node_;
    result.node_ = (Node *)local_110.m_;
    result.m_ = (InnerMap *)local_110.bucket_index_;
  }
  else {
    bVar1 = TableEntryIsNonEmptyList(this,(size_type)node_local);
    if (!bVar1) {
      InsertUniqueInTree(__return_storage_ptr__,this,(size_type)node_local,local_20);
      return __return_storage_ptr__;
    }
    bVar1 = TableEntryIsTooLong(this,(size_type)node_local);
    if (!bVar1) {
      InsertUniqueInList(__return_storage_ptr__,this,(size_type)node_local,local_20);
      return __return_storage_ptr__;
    }
    TreeConvert(this,(size_type)node_local);
    InsertUniqueInTree(&local_128,this,(size_type)node_local,local_20);
    local_88 = (undefined1  [8])local_128.node_;
    result.node_ = (Node *)local_128.m_;
    result.m_ = (InnerMap *)local_128.bucket_index_;
    local_161 = 0;
    if ((InnerMap *)local_128.bucket_index_ != (InnerMap *)((ulong)node_local & 0xfffffffffffffffe))
    {
      internal::LogMessage::LogMessage
                (&local_160,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                 ,0x29c);
      local_161 = 1;
      pLVar2 = internal::LogMessage::operator<<
                         (&local_160,
                          "CHECK failed: (result.bucket_index_) == (b & ~static_cast<size_type>(1)): "
                         );
      internal::LogFinisher::operator=(&local_162,pLVar2);
    }
    if ((local_161 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_160);
    }
  }
  puVar3 = std::min<unsigned_long>(&this->index_of_first_non_null_,(unsigned_long *)&result.m_);
  this->index_of_first_non_null_ = *puVar3;
  __return_storage_ptr__->node_ = (Node *)local_88;
  __return_storage_ptr__->m_ = (InnerMap *)result.node_;
  __return_storage_ptr__->bucket_index_ = (size_type)result.m_;
  return __return_storage_ptr__;
}

Assistant:

iterator InsertUnique(size_type b, Node* node) {
      GOOGLE_DCHECK(index_of_first_non_null_ == num_buckets_ ||
             table_[index_of_first_non_null_] != NULL);
      // In practice, the code that led to this point may have already
      // determined whether we are inserting into an empty list, a short list,
      // or whatever.  But it's probably cheap enough to recompute that here;
      // it's likely that we're inserting into an empty or short list.
      iterator result;
      GOOGLE_DCHECK(find(*KeyPtrFromNodePtr(node)) == end());
      if (TableEntryIsEmpty(b)) {
        result = InsertUniqueInList(b, node);
      } else if (TableEntryIsNonEmptyList(b)) {
        if (GOOGLE_PREDICT_FALSE(TableEntryIsTooLong(b))) {
          TreeConvert(b);
          result = InsertUniqueInTree(b, node);
          GOOGLE_DCHECK_EQ(result.bucket_index_, b & ~static_cast<size_type>(1));
        } else {
          // Insert into a pre-existing list.  This case cannot modify
          // index_of_first_non_null_, so we skip the code to update it.
          return InsertUniqueInList(b, node);
        }
      } else {
        // Insert into a pre-existing tree.  This case cannot modify
        // index_of_first_non_null_, so we skip the code to update it.
        return InsertUniqueInTree(b, node);
      }
      // parentheses around (std::min) prevents macro expansion of min(...)
      index_of_first_non_null_ =
          (std::min)(index_of_first_non_null_, result.bucket_index_);
      return result;
    }